

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O0

S2ShapeIndexRegion<S2ShapeIndex> * __thiscall
S2ShapeIndexRegion<S2ShapeIndex>::Clone(S2ShapeIndexRegion<S2ShapeIndex> *this)

{
  S2ShapeIndexRegion<S2ShapeIndex> *this_00;
  S2ShapeIndex *index;
  int __c;
  char *in_RSI;
  S2ShapeIndexRegion<S2ShapeIndex> *this_local;
  
  this_00 = (S2ShapeIndexRegion<S2ShapeIndex> *)operator_new(0x28);
  index = (S2ShapeIndex *)S2ShapeIndexRegion<S2ShapeIndex>::index(this,in_RSI,__c);
  S2ShapeIndexRegion(this_00,index);
  return this_00;
}

Assistant:

S2ShapeIndexRegion<IndexType>* S2ShapeIndexRegion<IndexType>::Clone() const {
  return new S2ShapeIndexRegion<IndexType>(&index());
}